

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O2

nh_bool find_align(nh_roles_info *ri,char *align_str,int *out_align)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)ri->num_aligns;
  if (ri->num_aligns < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      return '\0';
    }
    iVar1 = strcmp(align_str,ri->alignnames[uVar2]);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
  }
  *out_align = (int)uVar2;
  return '\x01';
}

Assistant:

static nh_bool find_align(const struct nh_roles_info *ri,
			  const char *align_str, int *out_align)
{
    int i;

    for (i = 0; i < ri->num_aligns; i++) {
	if (!strcmp(align_str, ri->alignnames[i])) {
	    *out_align = i;
	    return TRUE;
	}
    }
    return FALSE;
}